

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.h
# Opt level: O2

internalJSONNode * __thiscall internalJSONNode::makeUnique(internalJSONNode *this)

{
  ulong uVar1;
  allocator local_31;
  json_string local_30;
  
  uVar1 = this->refcount;
  if (uVar1 < 2) {
    std::__cxx11::string::string
              ((string *)&local_30,"makeUnique on a 0 refcount internal",&local_31);
    JSONDebug::_JSON_ASSERT(uVar1 == 1,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    decRef(this);
    this = newInternal(this);
  }
  return this;
}

Assistant:

inline internalJSONNode * internalJSONNode::makeUnique(void) json_nothrow {
    #ifdef JSON_REF_COUNT
	   if (refcount > 1){
		  decRef();
		  return newInternal(*this);
	   }
	   JSON_ASSERT(refcount == 1, JSON_TEXT("makeUnique on a 0 refcount internal"));
	   return this;
    #else
	   return newInternal(*this);
    #endif
}